

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

int __thiscall
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<duckdb::hugeint_t,int>
          (VectorTryCastOperator<duckdb::NumericTryCast> *this,hugeint_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  int iVar2;
  ValidityMask *pVVar3;
  hugeint_t input_00;
  hugeint_t input_01;
  int output;
  int local_54;
  string local_50;
  
  input_01.lower = input.lower;
  input_01.upper = (int64_t)&local_54;
  pVVar3 = mask;
  bVar1 = Hugeint::TryCast<int>((Hugeint *)this,input_01,(int32_t *)mask);
  if (!bVar1) {
    input_00.upper = (int64_t)pVVar3;
    input_00.lower = input_01.lower;
    CastExceptionText<duckdb::hugeint_t,int>(&local_50,(duckdb *)this,input_00);
    iVar2 = HandleVectorCastError::Operation<int>
                      (&local_50,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_54 = iVar2;
  }
  return local_54;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}